

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O3

void __thiscall
booster::aio::acceptor::async_accept(acceptor *this,stream_socket *target,event_handler *h)

{
  callable<void_(const_std::error_code_&)> *pcVar1;
  bool bVar2;
  pointer_type pVar3;
  atomic_counter *this_00;
  event_handler local_38;
  
  bVar2 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (bVar2) {
    pVar3.p_ = (callable<void_(const_std::error_code_&)> *)operator_new(0x28);
    ((pVar3.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_001cef10;
    this_00 = &((pVar3.p_)->super_refcounted).refs_;
    atomic_counter::atomic_counter(this_00,0);
    ((pVar3.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__async_acceptor_001cf2a8;
    pcVar1 = (h->call_ptr).p_;
    pVar3.p_[1].super_refcounted._vptr_refcounted = (_func_int **)pcVar1;
    if (pcVar1 != (callable<void_(const_std::error_code_&)> *)0x0) {
      atomic_counter::inc(&(pcVar1->super_refcounted).refs_);
    }
    pVar3.p_[1].super_refcounted.refs_.value_.super___atomic_base<long>._M_i = (__int_type)target;
    pVar3.p_[2].super_refcounted._vptr_refcounted = (_func_int **)this;
    local_38.call_ptr.p_ = (pointer_type)(pointer_type)pVar3.p_;
    atomic_counter::inc(this_00);
    basic_io_device::on_readable((basic_io_device *)this,&local_38);
    intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_38.call_ptr);
  }
  return;
}

Assistant:

void acceptor::async_accept(stream_socket &target,event_handler const &h)
{
	if(!dont_block(h))
		return;
	async_acceptor::pointer acceptor(new async_acceptor( h, &target, this ));
	on_readable(std::move(acceptor));
}